

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclareFixture.hpp
# Opt level: O3

int __thiscall
ut11::detail::DeclareFixtureObj<AssertThatTests>::operator()<>
          (DeclareFixtureObj<AssertThatTests> *this,Category *category)

{
  undefined8 *puVar1;
  pointer pcVar2;
  AssertThatTests *this_00;
  undefined8 *puVar3;
  ulong uVar4;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Head_base<0UL,_AssertThatTests_*,_false> local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  shared_ptr<ut11::detail::TestFixtureAbstract> local_70;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined2 *local_40;
  undefined8 local_38;
  undefined2 local_30 [8];
  
  this_00 = (AssertThatTests *)operator_new(0xf8);
  memset(this_00,0,0xf8);
  TestFixture::TestFixture((TestFixture *)this_00);
  (this_00->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__AssertThatTests_0025e888;
  (this_00->file)._M_dataplus._M_p = (pointer)&(this_00->file).field_2;
  (this_00->file)._M_string_length = 0;
  (this_00->file).field_2._M_local_buf[0] = '\0';
  (this_00->message)._M_dataplus._M_p = (pointer)&(this_00->message).field_2;
  (this_00->message)._M_string_length = 0;
  (this_00->message).field_2._M_local_buf[0] = '\0';
  (this_00->caughtException).m_line = 0;
  (this_00->caughtException).m_file._M_dataplus._M_p =
       (pointer)&(this_00->caughtException).m_file.field_2;
  (this_00->caughtException).m_file._M_string_length = 0;
  (this_00->caughtException).m_file.field_2._M_local_buf[0] = '\0';
  (this_00->caughtException).m_message._M_dataplus._M_p =
       (pointer)&(this_00->caughtException).m_message.field_2;
  (this_00->caughtException).m_message._M_string_length = 0;
  (this_00->caughtException).m_message.field_2._M_local_buf[0] = '\0';
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  local_b8._M_head_impl = this_00;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (this->m_name)._M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  local_30[0] = 0x29;
  local_38 = 1;
  uVar4 = 0xf;
  if (local_90 != local_80) {
    uVar4 = local_80[0];
  }
  local_40 = local_30;
  if ((local_88 + 1U < 0x10) && (uVar4 < local_88 + 1U)) {
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_90);
  }
  else {
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_30);
  }
  local_b0 = &local_a0;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar3[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar3;
  }
  local_a8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::_M_assign((string *)&(this_00->super_TestFixture).m_name);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  pcVar2 = (category->m_category)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + (category->m_category)._M_string_length);
  (*(this_00->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[2])
            (this_00,local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  std::__shared_ptr<ut11::detail::TestFixtureAbstract,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AssertThatTests,std::default_delete<AssertThatTests>,void>
            ((__shared_ptr<ut11::detail::TestFixtureAbstract,(__gnu_cxx::_Lock_policy)2> *)&local_70
             ,(unique_ptr<AssertThatTests,_std::default_delete<AssertThatTests>_> *)&local_b8);
  PushFixture(&local_70);
  if (local_70.super___shared_ptr<ut11::detail::TestFixtureAbstract,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<ut11::detail::TestFixtureAbstract,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b8._M_head_impl != (AssertThatTests *)0x0) {
    (*((local_b8._M_head_impl)->super_TestFixture).super_TestFixtureAbstract.
      _vptr_TestFixtureAbstract[1])();
  }
  return 0;
}

Assistant:

int operator()(Category category, ARGS && ... args)
			{
				std::unique_ptr<T> fixture(new T(std::forward<ARGS>(args)...));
				fixture->SetName(m_name + "(" + GetString(args...));
				fixture->AddCategory(category);

				PushFixture(std::move(fixture));
				return 0;
			}